

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

StackSym * __thiscall
GlobOpt::GetOrCreateTaggedIntConstantStackSym(GlobOpt *this,int32 intConstantValue)

{
  long local_30;
  GlobOpt *local_28;
  StackSym *stackSym;
  GlobOpt *pGStack_18;
  int32 intConstantValue_local;
  GlobOpt *this_local;
  
  stackSym._4_4_ = intConstantValue;
  pGStack_18 = this;
  local_28 = (GlobOpt *)GetTaggedIntConstantStackSym(this,intConstantValue);
  this_local = local_28;
  if (local_28 == (GlobOpt *)0x0) {
    local_28 = (GlobOpt *)StackSym::New(TyVar,this->func);
    local_30 = (long)stackSym._4_4_;
    JsUtil::
    BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Add(this->intConstantToStackSymMap,&local_30,(StackSym **)&local_28);
    this_local = local_28;
  }
  return (StackSym *)this_local;
}

Assistant:

StackSym *GlobOpt::GetOrCreateTaggedIntConstantStackSym(const int32 intConstantValue) const
{
    StackSym *stackSym = GetTaggedIntConstantStackSym(intConstantValue);
    if(stackSym)
    {
        return stackSym;
    }

    stackSym = StackSym::New(TyVar,func);
    intConstantToStackSymMap->Add(intConstantValue, stackSym);
    return stackSym;
}